

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numericsort.c
# Opt level: O2

int numericsort(dirent **A,dirent **B,int cs)

{
  char *pcVar1;
  ushort *puVar2;
  int iVar3;
  ushort **ppuVar4;
  int iVar5;
  byte bVar6;
  uint uVar7;
  int iVar8;
  uchar *puVar9;
  uchar *puVar10;
  
  puVar9 = (uchar *)(*A)->d_name;
  puVar10 = (uchar *)(*B)->d_name;
  ppuVar4 = __ctype_b_loc();
  puVar2 = *ppuVar4;
  while( true ) {
    iVar3 = 0;
    while( true ) {
      bVar6 = *puVar9;
      iVar8 = (int)(char)bVar6;
      if (((*(byte *)((long)puVar2 + (ulong)(uint)bVar6 * 2 + 1) & 8) == 0) ||
         ((*(byte *)((long)puVar2 + (ulong)*puVar10 * 2 + 1) & 8) == 0)) break;
      puVar9 = puVar9 + -1;
      do {
        bVar6 = puVar9[1];
        puVar9 = puVar9 + 1;
      } while (bVar6 == 0x30);
      puVar10 = puVar10 + -1;
      do {
        pcVar1 = (char *)(puVar10 + 1);
        puVar10 = puVar10 + 1;
      } while (*pcVar1 == 0x30);
      while( true ) {
        uVar7 = (uint)puVar2[bVar6];
        if (((puVar2[bVar6] >> 0xb & 1) == 0) || (bVar6 != *puVar10)) break;
        puVar10 = puVar10 + 1;
        bVar6 = puVar9[1];
        puVar9 = puVar9 + 1;
      }
      iVar5 = 0;
      iVar8 = 0;
      if (((*(byte *)((long)puVar2 + (ulong)bVar6 * 2 + 1) & 8) != 0) &&
         (iVar5 = (int)(char)bVar6 - (int)(char)*puVar10, iVar8 = 0,
         (*(byte *)((long)puVar2 + (ulong)*puVar10 * 2 + 1) & 8) == 0)) {
        iVar5 = 0;
      }
      while ((uVar7 >> 0xb & 1) != 0) {
        pcVar1 = (char *)(puVar9 + 1);
        puVar9 = puVar9 + 1;
        iVar8 = iVar8 + 1;
        uVar7 = (uint)puVar2[(byte)*pcVar1];
      }
      while ((*(byte *)((long)puVar2 + (ulong)*puVar10 * 2 + 1) & 8) != 0) {
        iVar8 = iVar8 + -1;
        puVar10 = puVar10 + 1;
      }
      if (iVar5 != 0) {
        iVar3 = iVar5;
      }
      if (iVar8 != 0) {
        iVar3 = iVar8;
      }
      if (iVar8 != 0 || iVar5 != 0) goto LAB_001a4e43;
    }
    if (cs == 0) {
      iVar8 = tolower((uint)bVar6);
      iVar3 = tolower((uint)*puVar10);
    }
    else {
      iVar3 = (int)(char)*puVar10;
    }
    iVar3 = iVar8 - iVar3;
    if (iVar3 != 0) break;
    if (bVar6 == 0) {
      return 0;
    }
    puVar9 = puVar9 + 1;
    puVar10 = puVar10 + 1;
  }
LAB_001a4e43:
  if (iVar3 == 0) {
    return 0;
  }
  return iVar3 >> 0x1f | 1;
}

Assistant:

static int numericsort(struct dirent **A, struct dirent **B, int cs) {
  const char* a = (*A)->d_name;
  const char* b = (*B)->d_name;
  int ret = 0;
  for (;;) {
    if (isdigit(*a & 255) && isdigit(*b & 255)) {
      int diff,magdiff;
      while (*a == '0') a++;
      while (*b == '0') b++;
      while (isdigit(*a & 255) && *a == *b) {a++; b++;}
      diff = (isdigit(*a & 255) && isdigit(*b & 255)) ? *a - *b : 0;
      magdiff = 0;
      while (isdigit(*a & 255)) {magdiff++; a++;}
      while (isdigit(*b & 255)) {magdiff--; b++;}
      if (magdiff) {ret = magdiff; break;} /* compare # of significant digits*/
      if (diff) {ret = diff; break;}	/* compare first non-zero digit */
    } else {
      if (cs) {
      	/* compare case-sensitive */
	if ((ret = *a-*b)) break;
      } else {
	/* compare case-insensitve */
	if ((ret = tolower(*a & 255)-tolower(*b & 255))) break;
      }

      if (!*a) break;
      a++; b++;
    }
  }
  if (!ret) return 0;
  else return (ret < 0) ? -1 : 1;
}